

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O2

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::computeMinMaxResidualActivity
          (SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *lp,int rowNumber,int colNumber,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *minAct,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *maxAct)

{
  int iVar1;
  pointer pnVar2;
  Real RVar3;
  bool bVar4;
  type_conflict5 tVar5;
  bool bVar6;
  bool bVar7;
  double *pdVar8;
  long lVar9;
  long lVar10;
  cpp_dec_float<200U,_int,_void> *pcVar11;
  uint *puVar12;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar13;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar14;
  bool bVar15;
  shared_ptr<soplex::Tolerances> *psVar16;
  Item *pIVar17;
  long lVar18;
  byte bVar19;
  undefined1 local_4b8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_4b0;
  uint local_4a8 [23];
  undefined3 uStack_44b;
  int iStack_448;
  bool bStack_444;
  undefined8 local_440;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_430;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_330;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b0;
  cpp_dec_float<200U,_int,_void> local_230;
  cpp_dec_float<200U,_int,_void> local_1b0;
  cpp_dec_float<200U,_int,_void> local_130;
  cpp_dec_float<200U,_int,_void> local_b0;
  
  bVar19 = 0;
  pIVar17 = (lp->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.theitem +
            (lp->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.thekey[rowNumber].idx;
  lVar18 = 0;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=(&minAct->m_backend,0);
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=(&maxAct->m_backend,0);
  psVar16 = &(this->
             super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._tolerances;
  lVar10 = 0;
  bVar15 = false;
  bVar7 = false;
  do {
    if ((pIVar17->data).
        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .memused <= lVar10) {
      if (bVar15) {
        pdVar8 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<200U,_int,_void> *)local_4b8,-*pdVar8,(type *)0x0);
        pcVar11 = (cpp_dec_float<200U,_int,_void> *)local_4b8;
        pnVar14 = minAct;
        for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pnVar14->m_backend).data._M_elems[0] = (pcVar11->data)._M_elems[0];
          pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar19 * -8 + 4);
          pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar14 + ((ulong)bVar19 * -2 + 1) * 4);
        }
        (minAct->m_backend).exp = iStack_448;
        (minAct->m_backend).neg = bStack_444;
        (minAct->m_backend).fpclass = (fpclass_type)local_440;
        (minAct->m_backend).prec_elem = local_440._4_4_;
      }
      if (bVar7) {
        pdVar8 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<200U,_int,_void> *)local_4b8,*pdVar8,(type *)0x0);
        pcVar11 = (cpp_dec_float<200U,_int,_void> *)local_4b8;
        pnVar14 = maxAct;
        for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pnVar14->m_backend).data._M_elems[0] = (pcVar11->data)._M_elems[0];
          pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar19 * -8 + 4);
          pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar14 + ((ulong)bVar19 * -2 + 1) * 4);
        }
        (maxAct->m_backend).exp = iStack_448;
        (maxAct->m_backend).neg = bStack_444;
        (maxAct->m_backend).fpclass = (fpclass_type)local_440;
        (maxAct->m_backend).prec_elem = local_440._4_4_;
      }
      return;
    }
    pNVar13 = (pIVar17->data).
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .m_elem;
    if ((colNumber < 0) || (*(int *)((long)(&pNVar13->val + 1) + lVar18) != colNumber)) {
      puVar12 = (uint *)((long)&(pNVar13->val).m_backend.data + lVar18);
      pnVar14 = &local_2b0;
      for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
        (pnVar14->m_backend).data._M_elems[0] = *puVar12;
        puVar12 = puVar12 + (ulong)bVar19 * -2 + 1;
        pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar14 + ((ulong)bVar19 * -2 + 1) * 4);
      }
      local_2b0.m_backend.exp = *(int *)((long)&(pNVar13->val).m_backend.data + lVar18 + 0x70);
      local_2b0.m_backend.neg = *(bool *)((long)&(pNVar13->val).m_backend.data + lVar18 + 0x74);
      local_2b0.m_backend._120_8_ =
           *(undefined8 *)((long)&(pNVar13->val).m_backend.data + lVar18 + 0x78);
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                (&local_b0,0.0,(type *)0x0);
      std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_4b8,
                 &psVar16->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
      RVar3 = Tolerances::epsilon((Tolerances *)local_4b8);
      bVar4 = GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                        (&local_2b0,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_b0,RVar3);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_4b0);
      pNVar13 = (pIVar17->data).
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .m_elem;
      if (bVar4) {
        iVar1 = *(int *)((long)(&pNVar13->val + 1) + lVar18);
        pnVar2 = (lp->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).low.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pdVar8 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<200U,_int,_void> *)local_4b8,-*pdVar8,(type *)0x0);
        tVar5 = boost::multiprecision::operator<=
                          (pnVar2 + iVar1,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)local_4b8);
        bVar4 = true;
        if (!tVar5) {
          pNVar13 = (pIVar17->data).
                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .m_elem;
          pcVar11 = &(lp->
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).low.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start
                     [*(int *)((long)(&pNVar13->val + 1) + lVar18)].m_backend;
LAB_00427ebd:
          local_440._0_4_ = cpp_dec_float_finite;
          local_440._4_4_ = 0x1c;
          local_4b8 = (undefined1  [8])0x0;
          _Stack_4b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_4a8[0] = 0;
          local_4a8[1] = 0;
          local_4a8[2] = 0;
          local_4a8[3] = 0;
          local_4a8[4] = 0;
          local_4a8[5] = 0;
          local_4a8[6] = 0;
          local_4a8[7] = 0;
          local_4a8[8] = 0;
          local_4a8[9] = 0;
          local_4a8[10] = 0;
          local_4a8[0xb] = 0;
          local_4a8[0xc] = 0;
          local_4a8[0xd] = 0;
          local_4a8[0xe] = 0;
          local_4a8[0xf] = 0;
          local_4a8[0x10] = 0;
          local_4a8[0x11] = 0;
          local_4a8[0x12] = 0;
          local_4a8[0x13] = 0;
          local_4a8[0x14] = 0;
          local_4a8[0x15] = 0;
          stack0xfffffffffffffbb0 = 0;
          uStack_44b = 0;
          iStack_448 = 0;
          bStack_444 = false;
          boost::multiprecision::default_ops::
          eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    ((cpp_dec_float<200U,_int,_void> *)local_4b8,
                     (cpp_dec_float<200U,_int,_void> *)
                     ((long)&(pNVar13->val).m_backend.data + lVar18),pcVar11);
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                    (&minAct->m_backend,(cpp_dec_float<200U,_int,_void> *)local_4b8);
          bVar4 = bVar15;
        }
      }
      else {
        puVar12 = (uint *)((long)&(pNVar13->val).m_backend.data + lVar18);
        pnVar14 = &local_330;
        for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
          (pnVar14->m_backend).data._M_elems[0] = *puVar12;
          puVar12 = puVar12 + (ulong)bVar19 * -2 + 1;
          pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar14 + ((ulong)bVar19 * -2 + 1) * 4);
        }
        local_330.m_backend.exp = *(int *)((long)&(pNVar13->val).m_backend.data + lVar18 + 0x70);
        local_330.m_backend.neg = *(bool *)((long)&(pNVar13->val).m_backend.data + lVar18 + 0x74);
        local_330.m_backend._120_8_ =
             *(undefined8 *)((long)&(pNVar13->val).m_backend.data + lVar18 + 0x78);
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                  (&local_130,0.0,(type *)0x0);
        std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_4b8,
                   &psVar16->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
        RVar3 = Tolerances::epsilon((Tolerances *)local_4b8);
        bVar6 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                          (&local_330,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_130,RVar3);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_4b0);
        bVar4 = bVar15;
        if (bVar6) {
          iVar1 = *(int *)((long)(&((pIVar17->data).
                                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   .m_elem)->val + 1) + lVar18);
          pnVar2 = (lp->
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).up.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pdVar8 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                    ((cpp_dec_float<200U,_int,_void> *)local_4b8,*pdVar8,(type *)0x0);
          tVar5 = boost::multiprecision::operator>=
                            (pnVar2 + iVar1,
                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)local_4b8);
          bVar4 = true;
          if (!tVar5) {
            pNVar13 = (pIVar17->data).
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .m_elem;
            pcVar11 = &(lp->
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).up.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start
                       [*(int *)((long)(&pNVar13->val + 1) + lVar18)].m_backend;
            goto LAB_00427ebd;
          }
        }
      }
      pNVar13 = (pIVar17->data).
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .m_elem;
      puVar12 = (uint *)((long)&(pNVar13->val).m_backend.data + lVar18);
      pnVar14 = &local_3b0;
      for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
        (pnVar14->m_backend).data._M_elems[0] = *puVar12;
        puVar12 = puVar12 + (ulong)bVar19 * -2 + 1;
        pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar14 + ((ulong)bVar19 * -2 + 1) * 4);
      }
      local_3b0.m_backend.exp = *(int *)((long)&(pNVar13->val).m_backend.data + lVar18 + 0x70);
      local_3b0.m_backend.neg = *(bool *)((long)&(pNVar13->val).m_backend.data + lVar18 + 0x74);
      local_3b0.m_backend._120_8_ =
           *(undefined8 *)((long)&(pNVar13->val).m_backend.data + lVar18 + 0x78);
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                (&local_1b0,0.0,(type *)0x0);
      std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_4b8,
                 &psVar16->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
      RVar3 = Tolerances::epsilon((Tolerances *)local_4b8);
      bVar6 = GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                        (&local_3b0,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_1b0,RVar3);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_4b0);
      pNVar13 = (pIVar17->data).
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .m_elem;
      bVar15 = bVar4;
      if (bVar6) {
        iVar1 = *(int *)((long)(&pNVar13->val + 1) + lVar18);
        pnVar2 = (lp->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).up.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pdVar8 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<200U,_int,_void> *)local_4b8,*pdVar8,(type *)0x0);
        tVar5 = boost::multiprecision::operator>=
                          (pnVar2 + iVar1,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)local_4b8);
        if (tVar5) {
LAB_004280d0:
          bVar7 = true;
        }
        else {
          pNVar13 = (pIVar17->data).
                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .m_elem;
          pcVar11 = &(lp->
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).up.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start
                     [*(int *)((long)(&pNVar13->val + 1) + lVar18)].m_backend;
LAB_004280ef:
          local_440._0_4_ = cpp_dec_float_finite;
          local_440._4_4_ = 0x1c;
          local_4b8 = (undefined1  [8])0x0;
          _Stack_4b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_4a8[0] = 0;
          local_4a8[1] = 0;
          local_4a8[2] = 0;
          local_4a8[3] = 0;
          local_4a8[4] = 0;
          local_4a8[5] = 0;
          local_4a8[6] = 0;
          local_4a8[7] = 0;
          local_4a8[8] = 0;
          local_4a8[9] = 0;
          local_4a8[10] = 0;
          local_4a8[0xb] = 0;
          local_4a8[0xc] = 0;
          local_4a8[0xd] = 0;
          local_4a8[0xe] = 0;
          local_4a8[0xf] = 0;
          local_4a8[0x10] = 0;
          local_4a8[0x11] = 0;
          local_4a8[0x12] = 0;
          local_4a8[0x13] = 0;
          local_4a8[0x14] = 0;
          local_4a8[0x15] = 0;
          stack0xfffffffffffffbb0 = 0;
          uStack_44b = 0;
          iStack_448 = 0;
          bStack_444 = false;
          boost::multiprecision::default_ops::
          eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    ((cpp_dec_float<200U,_int,_void> *)local_4b8,
                     (cpp_dec_float<200U,_int,_void> *)
                     ((long)&(pNVar13->val).m_backend.data + lVar18),pcVar11);
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                    (&maxAct->m_backend,(cpp_dec_float<200U,_int,_void> *)local_4b8);
        }
      }
      else {
        puVar12 = (uint *)((long)&(pNVar13->val).m_backend.data + lVar18);
        pnVar14 = &local_430;
        for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
          (pnVar14->m_backend).data._M_elems[0] = *puVar12;
          puVar12 = puVar12 + (ulong)bVar19 * -2 + 1;
          pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar14 + ((ulong)bVar19 * -2 + 1) * 4);
        }
        local_430.m_backend.exp = *(int *)((long)&(pNVar13->val).m_backend.data + lVar18 + 0x70);
        local_430.m_backend.neg = *(bool *)((long)&(pNVar13->val).m_backend.data + lVar18 + 0x74);
        local_430.m_backend._120_8_ =
             *(undefined8 *)((long)&(pNVar13->val).m_backend.data + lVar18 + 0x78);
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                  (&local_230,0.0,(type *)0x0);
        std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_4b8,
                   &psVar16->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
        RVar3 = Tolerances::epsilon((Tolerances *)local_4b8);
        bVar4 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                          (&local_430,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_230,RVar3);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_4b0);
        if (bVar4) {
          iVar1 = *(int *)((long)(&((pIVar17->data).
                                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   .m_elem)->val + 1) + lVar18);
          pnVar2 = (lp->
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).low.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pdVar8 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                    ((cpp_dec_float<200U,_int,_void> *)local_4b8,-*pdVar8,(type *)0x0);
          tVar5 = boost::multiprecision::operator<=
                            (pnVar2 + iVar1,
                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)local_4b8);
          if (tVar5) goto LAB_004280d0;
          pNVar13 = (pIVar17->data).
                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .m_elem;
          pcVar11 = &(lp->
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).low.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start
                     [*(int *)((long)(&pNVar13->val + 1) + lVar18)].m_backend;
          goto LAB_004280ef;
        }
      }
    }
    lVar10 = lVar10 + 1;
    lVar18 = lVar18 + 0x84;
  } while( true );
}

Assistant:

void SPxMainSM<R>::computeMinMaxResidualActivity(SPxLPBase<R>& lp, int rowNumber, int colNumber,
      R& minAct, R& maxAct)
{
   const SVectorBase<R>& row = lp.rowVector(rowNumber);
   bool minNegInfinite = false;
   bool maxInfinite = false;

   minAct = 0;   // this is the minimum value that the aggregation can attain
   maxAct = 0;   // this is the maximum value that the aggregation can attain

   for(int l = 0; l < row.size(); ++l)
   {
      if(colNumber < 0 || row.index(l) != colNumber)
      {
         // computing the minimum activity of the aggregated variables
         if(GT(row.value(l), R(0.0), this->tolerances()->epsilon()))
         {
            if(lp.lower(row.index(l)) <= R(-infinity))
               minNegInfinite = true;
            else
               minAct += row.value(l) * lp.lower(row.index(l));
         }
         else if(LT(row.value(l), R(0.0), this->tolerances()->epsilon()))
         {
            if(lp.upper(row.index(l)) >= R(infinity))
               minNegInfinite = true;
            else
               minAct += row.value(l) * lp.upper(row.index(l));
         }

         // computing the maximum activity of the aggregated variables
         if(GT(row.value(l), R(0.0), this->tolerances()->epsilon()))
         {
            if(lp.upper(row.index(l)) >= R(infinity))
               maxInfinite = true;
            else
               maxAct += row.value(l) * lp.upper(row.index(l));
         }
         else if(LT(row.value(l), R(0.0), this->tolerances()->epsilon()))
         {
            if(lp.lower(row.index(l)) <= R(-infinity))
               maxInfinite = true;
            else
               maxAct += row.value(l) * lp.lower(row.index(l));
         }
      }
   }

   // if an infinite value exists for the minimum activity, then that it taken
   if(minNegInfinite)
      minAct = R(-infinity);

   // if an -infinite value exists for the maximum activity, then that value is taken
   if(maxInfinite)
      maxAct = R(infinity);
}